

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O1

void ev_loop_destroy(ev_loop *loop)

{
  long lVar1;
  
  if (loop != (ev_loop *)0x0) {
    if (loop->cleanupcnt != 0) {
      ev_loop_destroy_cold_1();
    }
    if ((ev_default_loop_ptr == loop) && (childev.active != 0)) {
      loop->activecnt = loop->activecnt + 1;
      ev_signal_stop(loop,&childev);
    }
    if ((loop->pipe_w).active != 0) {
      if (-1 < loop->evpipe[0]) {
        close(loop->evpipe[0]);
      }
      if (-1 < loop->evpipe[1]) {
        close(loop->evpipe[1]);
      }
    }
    if ((loop->sigfd_w).active != 0) {
      close(loop->sigfd);
    }
    if (-1 < loop->fs_fd) {
      close(loop->fs_fd);
    }
    if (-1 < loop->backend_fd) {
      close(loop->backend_fd);
    }
    if (loop->backend == 4) {
      ev_realloc(loop->epoll_events,0);
      ev_realloc(loop->epoll_eperms,0);
      loop->epoll_eperms = (int *)0x0;
      loop->epoll_epermcnt = 0;
      loop->epoll_epermmax = 0;
    }
    if (loop->backend == 2) {
      ev_realloc(loop->pollidxs,0);
      ev_realloc(loop->polls,0);
    }
    if (loop->backend == 1) {
      ev_realloc(loop->vec_ri,0);
      ev_realloc(loop->vec_ro,0);
      ev_realloc(loop->vec_wi,0);
      ev_realloc(loop->vec_wo,0);
    }
    lVar1 = 0;
    do {
      ev_realloc(loop->pendings[lVar1 + 4],0);
      loop->pendingmax[lVar1 + 4] = 0;
      loop->pendingcnt[lVar1 + 4] = 0;
      loop->pendings[lVar1 + 4] = (ANPENDING *)0x0;
      ev_realloc(loop->idles[lVar1 + 4],0);
      loop->idlemax[lVar1 + 4] = 0;
      loop->idlecnt[lVar1 + 4] = 0;
      loop->idles[lVar1 + 4] = (ev_idle **)0x0;
      lVar1 = lVar1 + -1;
    } while (lVar1 != -5);
    ev_realloc(loop->anfds,0);
    loop->anfds = (ANFD *)0x0;
    loop->anfdmax = 0;
    ev_realloc(loop->rfeeds,0);
    loop->rfeeds = (W *)0x0;
    loop->rfeedmax = 0;
    loop->rfeedcnt = 0;
    ev_realloc(loop->fdchanges,0);
    loop->fdchanges = (int *)0x0;
    loop->fdchangemax = 0;
    loop->fdchangecnt = 0;
    ev_realloc(loop->timers,0);
    loop->timers = (ANHE *)0x0;
    loop->timermax = 0;
    loop->timercnt = 0;
    ev_realloc(loop->periodics,0);
    loop->periodics = (ANHE *)0x0;
    loop->periodicmax = 0;
    loop->periodiccnt = 0;
    ev_realloc(loop->forks,0);
    loop->forks = (ev_fork **)0x0;
    loop->forkmax = 0;
    loop->forkcnt = 0;
    ev_realloc(loop->cleanups,0);
    loop->cleanups = (ev_cleanup **)0x0;
    loop->cleanupmax = 0;
    loop->cleanupcnt = 0;
    ev_realloc(loop->prepares,0);
    loop->prepares = (ev_prepare **)0x0;
    loop->preparemax = 0;
    loop->preparecnt = 0;
    ev_realloc(loop->checks,0);
    loop->checks = (ev_check **)0x0;
    loop->checkmax = 0;
    loop->checkcnt = 0;
    ev_realloc(loop->asyncs,0);
    loop->backend = 0;
    loop->asyncs = (ev_async **)0x0;
    loop->asyncmax = 0;
    loop->asynccnt = 0;
    if (ev_default_loop_ptr != loop) {
      ev_realloc(loop,0);
      return;
    }
    ev_default_loop_ptr = (ev_loop *)0x0;
  }
  return;
}

Assistant:

void ecb_cold
ev_loop_destroy (EV_P)
{
  int i;

#if EV_MULTIPLICITY
  /* mimic free (0) */
  if (!EV_A)
    return;
#endif

#if EV_CLEANUP_ENABLE
  /* queue cleanup watchers (and execute them) */
  if (expect_false (cleanupcnt))
    {
      queue_events (EV_A_ (W *)cleanups, cleanupcnt, EV_CLEANUP);
      EV_INVOKE_PENDING;
    }
#endif

#if EV_CHILD_ENABLE
  if (ev_is_default_loop (EV_A) && ev_is_active (&childev))
    {
      ev_ref (EV_A); /* child watcher */
      ev_signal_stop (EV_A_ &childev);
    }
#endif

  if (ev_is_active (&pipe_w))
    {
      /*ev_ref (EV_A);*/
      /*ev_io_stop (EV_A_ &pipe_w);*/

      if (evpipe [0] >= 0) EV_WIN32_CLOSE_FD (evpipe [0]);
      if (evpipe [1] >= 0) EV_WIN32_CLOSE_FD (evpipe [1]);
    }

#if EV_USE_SIGNALFD
  if (ev_is_active (&sigfd_w))
    close (sigfd);
#endif

#if EV_USE_INOTIFY
  if (fs_fd >= 0)
    close (fs_fd);
#endif

  if (backend_fd >= 0)
    close (backend_fd);

#if EV_USE_IOCP
  if (backend == EVBACKEND_IOCP  ) iocp_destroy   (EV_A);
#endif
#if EV_USE_PORT
  if (backend == EVBACKEND_PORT  ) port_destroy   (EV_A);
#endif
#if EV_USE_KQUEUE
  if (backend == EVBACKEND_KQUEUE) kqueue_destroy (EV_A);
#endif
#if EV_USE_EPOLL
  if (backend == EVBACKEND_EPOLL ) epoll_destroy  (EV_A);
#endif
#if EV_USE_POLL
  if (backend == EVBACKEND_POLL  ) poll_destroy   (EV_A);
#endif
#if EV_USE_SELECT
  if (backend == EVBACKEND_SELECT) select_destroy (EV_A);
#endif

  for (i = NUMPRI; i--; )
    {
      array_free (pending, [i]);
#if EV_IDLE_ENABLE
      array_free (idle, [i]);
#endif
    }

  ev_free (anfds); anfds = 0; anfdmax = 0;

  /* have to use the microsoft-never-gets-it-right macro */
  array_free (rfeed, EMPTY);
  array_free (fdchange, EMPTY);
  array_free (timer, EMPTY);
#if EV_PERIODIC_ENABLE
  array_free (periodic, EMPTY);
#endif
#if EV_FORK_ENABLE
  array_free (fork, EMPTY);
#endif
#if EV_CLEANUP_ENABLE
  array_free (cleanup, EMPTY);
#endif
  array_free (prepare, EMPTY);
  array_free (check, EMPTY);
#if EV_ASYNC_ENABLE
  array_free (async, EMPTY);
#endif

  backend = 0;

#if EV_MULTIPLICITY
  if (ev_is_default_loop (EV_A))
#endif
    ev_default_loop_ptr = 0;
#if EV_MULTIPLICITY
  else
    ev_free (EV_A);
#endif
}